

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtStretch6(word *pInOut,int nVarS,int nVarB)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  word *pwVar5;
  ulong uVar6;
  
  if (nVarS != nVarB) {
    if (nVarB <= nVarS) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar4 = 1 << ((char)nVarS - 6U & 0x1f);
    if (nVarS < 7) {
      uVar4 = 1;
    }
    uVar3 = 1 << ((char)nVarB - 6U & 0x1f);
    if (nVarB < 7) {
      uVar3 = 1;
    }
    if (uVar4 != uVar3) {
      if ((int)uVar3 <= (int)uVar4) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      lVar1 = 0;
      uVar2 = 0;
      if (0 < (int)uVar4) {
        uVar2 = (ulong)uVar4;
      }
      pwVar5 = pInOut;
      for (; lVar1 < (int)uVar3; lVar1 = lVar1 + (int)uVar4) {
        for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
          pwVar5[uVar6] = pInOut[uVar6];
        }
        pwVar5 = pwVar5 + (int)uVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtStretch6( word * pInOut, int nVarS, int nVarB )
{
    int w, i, step, nWords;
    if ( nVarS == nVarB )
        return;
    assert( nVarS < nVarB );
    step = Abc_Truth6WordNum(nVarS);
    nWords = Abc_Truth6WordNum(nVarB);
    if ( step == nWords )
        return;
    assert( step < nWords );
    for ( w = 0; w < nWords; w += step )
        for ( i = 0; i < step; i++ )
            pInOut[w + i] = pInOut[i];              
}